

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void ListSilentOrExternalEmits(void)

{
  char local_48 [8];
  char silentOrExternalBytes [61];
  
  if (nListBytes != 0) {
    CompiledCurrentLine = CompiledCurrentLine + 1;
    memcpy(local_48,"; these bytes were emitted silently/externally (lua script?)",0x3d);
    substitutedLine = local_48;
    eolComment = (char *)0x0;
    ListFile(false);
    substitutedLine = line;
  }
  return;
}

Assistant:

void ListSilentOrExternalEmits() {
	// catch silent/external emits like "sj.add_byte(0x123)" from Lua script
	if (0 == nListBytes) return;		// no silent/external emit happened
	++CompiledCurrentLine;
	char silentOrExternalBytes[] = "; these bytes were emitted silently/externally (lua script?)";
	substitutedLine = silentOrExternalBytes;
	eolComment = nullptr;
	ListFile();
	substitutedLine = line;
}